

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RFC1751.cpp
# Opt level: O3

void jbcoin::RFC1751::btoe(string *strHuman,string *strData)

{
  unsigned_long uVar1;
  long *plVar2;
  long *plVar3;
  uint start;
  char cVar4;
  char caBuffer [9];
  long *local_1d8;
  long local_1d0;
  long local_1c8;
  long lStack_1c0;
  long *local_1b8;
  long local_1b0;
  long local_1a8;
  long lStack_1a0;
  long *local_198;
  long local_190;
  long local_188;
  long lStack_180;
  long *local_178;
  long local_170;
  long local_168;
  long lStack_160;
  long *local_158;
  long local_150;
  long local_148;
  long lStack_140;
  long *local_138;
  long local_130;
  long local_128;
  long lStack_120;
  string *local_118;
  ulong local_110;
  ulong local_108;
  undefined1 *local_100;
  undefined8 local_f8;
  undefined1 local_f0;
  undefined7 uStack_ef;
  long *local_e0;
  long local_d8;
  long local_d0;
  long lStack_c8;
  long *local_c0;
  long local_b8;
  long local_b0;
  long lStack_a8;
  long *local_a0;
  long local_98;
  long local_90;
  long lStack_88;
  long *local_80;
  long local_78;
  long local_70;
  long lStack_68;
  ulong local_60;
  char local_58;
  long *local_50;
  long local_48;
  long local_40;
  long lStack_38;
  
  local_60 = *(ulong *)(strData->_M_dataplus)._M_p;
  local_108 = local_60 >> 0x10;
  local_110 = local_60 >> 0x28;
  start = 0xfffffffe;
  cVar4 = '\0';
  local_118 = strHuman;
  do {
    start = start + 2;
    uVar1 = extract((char *)&local_60,start,2);
    cVar4 = cVar4 + (char)uVar1;
  } while (start < 0x3e);
  local_58 = cVar4 * '@';
  local_100 = &local_f0;
  local_f8 = 0;
  local_f0 = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_100);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_d0 = *plVar3;
    lStack_c8 = plVar2[3];
    local_e0 = &local_d0;
  }
  else {
    local_d0 = *plVar3;
    local_e0 = (long *)*plVar2;
  }
  local_d8 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_e0);
  local_1d8 = &local_1c8;
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_1c8 = *plVar3;
    lStack_1c0 = plVar2[3];
  }
  else {
    local_1c8 = *plVar3;
    local_1d8 = (long *)*plVar2;
  }
  local_1d0 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_1d8);
  local_1b8 = &local_1a8;
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_1a8 = *plVar3;
    lStack_1a0 = plVar2[3];
  }
  else {
    local_1a8 = *plVar3;
    local_1b8 = (long *)*plVar2;
  }
  local_1b0 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_1b8);
  local_198 = &local_188;
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_188 = *plVar3;
    lStack_180 = plVar2[3];
  }
  else {
    local_188 = *plVar3;
    local_198 = (long *)*plVar2;
  }
  local_190 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_198);
  local_178 = &local_168;
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_168 = *plVar3;
    lStack_160 = plVar2[3];
  }
  else {
    local_168 = *plVar3;
    local_178 = (long *)*plVar2;
  }
  local_170 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_178);
  local_158 = &local_148;
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_148 = *plVar3;
    lStack_140 = plVar2[3];
  }
  else {
    local_148 = *plVar3;
    local_158 = (long *)*plVar2;
  }
  local_150 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_158);
  local_138 = &local_128;
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_128 = *plVar3;
    lStack_120 = plVar2[3];
  }
  else {
    local_128 = *plVar3;
    local_138 = (long *)*plVar2;
  }
  local_130 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_138);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_b0 = *plVar3;
    lStack_a8 = plVar2[3];
    local_c0 = &local_b0;
  }
  else {
    local_b0 = *plVar3;
    local_c0 = (long *)*plVar2;
  }
  local_b8 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_c0);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_90 = *plVar3;
    lStack_88 = plVar2[3];
    local_a0 = &local_90;
  }
  else {
    local_90 = *plVar3;
    local_a0 = (long *)*plVar2;
  }
  local_98 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_a0);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_70 = *plVar3;
    lStack_68 = plVar2[3];
    local_80 = &local_70;
  }
  else {
    local_70 = *plVar3;
    local_80 = (long *)*plVar2;
  }
  local_78 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_80);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_40 = *plVar3;
    lStack_38 = plVar2[3];
    local_50 = &local_40;
  }
  else {
    local_40 = *plVar3;
    local_50 = (long *)*plVar2;
  }
  local_48 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  std::__cxx11::string::operator=((string *)local_118,(string *)&local_50);
  if (local_50 != &local_40) {
    operator_delete(local_50,local_40 + 1);
  }
  if (local_80 != &local_70) {
    operator_delete(local_80,local_70 + 1);
  }
  if (local_a0 != &local_90) {
    operator_delete(local_a0,local_90 + 1);
  }
  if (local_c0 != &local_b0) {
    operator_delete(local_c0,local_b0 + 1);
  }
  if (local_138 != &local_128) {
    operator_delete(local_138,local_128 + 1);
  }
  if (local_158 != &local_148) {
    operator_delete(local_158,local_148 + 1);
  }
  if (local_178 != &local_168) {
    operator_delete(local_178,local_168 + 1);
  }
  if (local_198 != &local_188) {
    operator_delete(local_198,local_188 + 1);
  }
  if (local_1b8 != &local_1a8) {
    operator_delete(local_1b8,local_1a8 + 1);
  }
  if (local_1d8 != &local_1c8) {
    operator_delete(local_1d8,local_1c8 + 1);
  }
  if (local_e0 != &local_d0) {
    operator_delete(local_e0,local_d0 + 1);
  }
  if (local_100 != &local_f0) {
    operator_delete(local_100,CONCAT71(uStack_ef,local_f0) + 1);
  }
  return;
}

Assistant:

void RFC1751::btoe (std::string& strHuman, std::string const& strData)
{
    char    caBuffer[9];     /* add in room for the parity 2 bits*/
    int     p, i;

    memcpy (caBuffer, strData.c_str (), 8);

    // compute parity: merely add groups of two bits.
    for (p = 0, i = 0; i < 64; i += 2)
        p += extract (caBuffer, i, 2);

    caBuffer[8] = char (p) << 6;

    strHuman    = std::string ()
                  + s_dictionary[extract (caBuffer, 0, 11)] + " "
                  + s_dictionary[extract (caBuffer, 11, 11)] + " "
                  + s_dictionary[extract (caBuffer, 22, 11)] + " "
                  + s_dictionary[extract (caBuffer, 33, 11)] + " "
                  + s_dictionary[extract (caBuffer, 44, 11)] + " "
                  + s_dictionary[extract (caBuffer, 55, 11)];
}